

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall
OpenMD::Integrator::setVelocitizer
          (Integrator *this,
          unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *velocitizer)

{
  unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *in_RSI;
  unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
  *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator=
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void Integrator::setVelocitizer(std::unique_ptr<Velocitizer> velocitizer) {
    velocitizer_ = std::move(velocitizer);
  }